

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# player-util.c
# Opt level: O1

void death_knowledge(player *p)

{
  uint32_t *puVar1;
  byte bVar2;
  object *poVar3;
  store_conflict *psVar4;
  object *poVar5;
  time_t death_time;
  time_t local_20;
  
  psVar4 = stores;
  bVar2 = f_info[0xe].shopnum;
  local_20 = 0;
  if (p->total_winner != 0) {
    p->depth = 0;
    my_strcpy(p->died_from,"Ripe Old Age",0x50);
    p->exp = p->max_exp;
    p->lev = p->max_lev;
    p->au = p->au + 10000000;
  }
  player_learn_all_runes(p);
  for (poVar5 = p->gear; poVar5 != (object *)0x0; poVar5 = poVar5->next) {
    object_flavor_aware(p,poVar5);
    poVar3 = poVar5->known;
    poVar3->effect = poVar5->effect;
    poVar3->activation = poVar5->activation;
  }
  for (poVar5 = psVar4[(ulong)bVar2 - 1].stock; poVar5 != (object *)0x0; poVar5 = poVar5->next) {
    object_flavor_aware(p,poVar5);
    poVar3 = poVar5->known;
    poVar3->effect = poVar5->effect;
    poVar3->activation = poVar5->activation;
  }
  history_unmask_unknown(p);
  time(&local_20);
  enter_score(p,&local_20);
  puVar1 = &p->upkeep->update;
  *puVar1 = *puVar1 | 1;
  handle_stuff(p);
  return;
}

Assistant:

void death_knowledge(struct player *p)
{
	struct store *home = &stores[f_info[FEAT_HOME].shopnum - 1];
	struct object *obj;
	time_t death_time = (time_t)0;

	/* Retire in the town in a good state */
	if (p->total_winner) {
		p->depth = 0;
		my_strcpy(p->died_from, "Ripe Old Age", sizeof(p->died_from));
		p->exp = p->max_exp;
		p->lev = p->max_lev;
		p->au += 10000000L;
	}

	player_learn_all_runes(p);
	for (obj = p->gear; obj; obj = obj->next) {
		object_flavor_aware(p, obj);
		obj->known->effect = obj->effect;
		obj->known->activation = obj->activation;
	}

	for (obj = home->stock; obj; obj = obj->next) {
		object_flavor_aware(p, obj);
		obj->known->effect = obj->effect;
		obj->known->activation = obj->activation;
	}

	history_unmask_unknown(p);

	/* Get time of death */
	(void)time(&death_time);
	enter_score(p, &death_time);

	/* Hack -- Recalculate bonuses */
	p->upkeep->update |= (PU_BONUS);
	handle_stuff(p);
}